

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall simplifyRational_rational_Test::TestBody(simplifyRational_rational_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr EVar2;
  AssertHelper local_90;
  Message local_88;
  shared_ptr<const_mathiu::impl::Expr> local_80;
  string local_70;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  ExprPtr f3o2;
  ExprPtr n2;
  simplifyRational_rational_Test *this_local;
  
  mathiu::impl::operator____i
            ((impl *)&f3o2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,2);
  mathiu::impl::fraction((Integer)local_30,3);
  EVar2 = mathiu::impl::operator+
                    ((impl *)&local_80,
                     (ExprPtr *)
                     &f3o2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(ExprPtr *)local_30);
  mathiu::impl::toString_abi_cxx11_
            (&local_70,(impl *)&local_80,
             (ExprPtr *)
             EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_50,"toString(n2 + f3o2)","\"7/2\"",&local_70,(char (*) [4])"7/2");
  std::__cxx11::string::~string((string *)&local_70);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x6a,message);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &f3o2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(simplifyRational, rational)
{
    auto const n2 = 2_i;
    auto const f3o2 = fraction(3, 2);

    EXPECT_EQ(toString(n2 + f3o2), "7/2");
}